

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmframe.cpp
# Opt level: O1

int __thiscall
VMFrameStack::Call(VMFrameStack *this,VMFunction *func,VMValue *params,int numparams,
                  VMReturn *results,int numresults,VMException **trap)

{
  VMFrame *callee;
  int iVar1;
  
  if ((func->super_DObject).field_0x24 == '\x01') {
    iVar1 = (*(code *)func[1].super_DObject._vptr_DObject)(this,params,numparams,results,numresults)
    ;
  }
  else {
    AllocFrame(this,(VMScriptFunction *)func);
    if ((this->Blocks == (BlockHeader *)0x0) ||
       (callee = this->Blocks->LastFrame, callee == (VMFrame *)0x0)) {
      __assert_fail("Blocks != NULL && Blocks->LastFrame != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/zscript/vm.h"
                    ,0x313,"VMFrame *VMFrameStack::TopFrame()");
    }
    VMFillParams(params,callee,numparams);
    iVar1 = (*VMExec)(this,(VMOP *)func[1].super_DObject._vptr_DObject,results,numresults);
    PopFrame(this);
  }
  return iVar1;
}

Assistant:

int VMFrameStack::Call(VMFunction *func, VMValue *params, int numparams, VMReturn *results, int numresults, VMException **trap)
{
	bool allocated = false;
	try
	{
		if (func->Native)
		{
			return static_cast<VMNativeFunction *>(func)->NativeCall(this, params, numparams, results, numresults);
		}
		else
		{
			AllocFrame(static_cast<VMScriptFunction *>(func));
			allocated = true;
			VMFillParams(params, TopFrame(), numparams);
			int numret = VMExec(this, static_cast<VMScriptFunction *>(func)->Code, results, numresults);
			PopFrame();
			return numret;
		}
	}
	catch (VMException *exception)
	{
		if (allocated)
		{
			PopFrame();
		}
		if (trap != NULL)
		{
			*trap = exception;
			return -1;
		}
		throw;
	}
	catch (...)
	{
		if (allocated)
		{
			PopFrame();
		}
		throw;
	}
}